

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O0

bool Omega_h::handle_one_include(InputList *list)

{
  bool bVar1;
  LO LVar2;
  InputList *list_00;
  InputMap *map;
  int local_1c;
  LO i;
  InputList *list_local;
  
  local_1c = 0;
  do {
    LVar2 = InputList::size(list);
    if (LVar2 <= local_1c) {
      return false;
    }
    bVar1 = InputList::is_list(list,local_1c);
    if (bVar1) {
      list_00 = InputList::get_list(list,local_1c);
      bVar1 = handle_one_include(list_00);
      if (bVar1) {
        return true;
      }
    }
    else {
      bVar1 = InputList::is_map(list,local_1c);
      if (bVar1) {
        map = InputList::get_map(list,local_1c);
        bVar1 = handle_one_include(map);
        if (bVar1) {
          return true;
        }
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

static bool handle_one_include(InputList& list) {
  for (LO i = 0; i < list.size(); ++i) {
    if (list.is_list(i)) {
      if (handle_one_include(list.get_list(i))) return true;
    } else if (list.is_map(i)) {
      if (handle_one_include(list.get_map(i))) return true;
    }
  }
  return false;
}